

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void detectAndDisplay(Mat *frame)

{
  ulong uVar1;
  long lVar2;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rgbChannels;
  Mat frame_gray;
  int *local_198;
  int *piStack_190;
  undefined8 local_188;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined1 *local_168;
  _InputArray *p_Stack_160;
  Size SStack_158;
  undefined8 uStack_150;
  undefined4 local_140 [2];
  undefined1 *local_138;
  undefined8 uStack_130;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_128;
  undefined8 local_110;
  undefined8 local_108;
  _InputArray local_100 [4];
  Rect local_a0;
  Mat local_90 [96];
  
  local_198 = (int *)0x0;
  piStack_190 = (int *)0x0;
  local_188 = 0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_128,3,(allocator_type *)local_100);
  local_100[0].sz.width = 0;
  local_100[0].sz.height = 0;
  local_100[0].flags = 0x1010000;
  SStack_158.width = 0;
  SStack_158.height = 0;
  local_168._0_4_ = 0x2050000;
  p_Stack_160 = (_InputArray *)&local_128;
  local_100[0].obj = frame;
  cv::split(local_100,(_OutputArray *)&local_168);
  cv::Mat::Mat((Mat *)local_100,
               local_128.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc0);
  SStack_158.width = 0;
  SStack_158.height = 0;
  local_168 = (undefined1 *)CONCAT44(local_168._4_4_,0x1010000);
  local_108 = 0x9600000096;
  local_110 = 0;
  p_Stack_160 = local_100;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_cascade,&local_168,&local_198,2,6,&local_108,&local_110);
  if (piStack_190 != local_198) {
    lVar2 = 0xc;
    uVar1 = 0;
    do {
      uStack_130 = 0;
      local_140[0] = 0x3010000;
      local_138 = debugImage;
      local_178 = *(undefined4 *)((long)local_198 + lVar2 + -0xc);
      local_174 = *(undefined4 *)((long)local_198 + lVar2 + -8);
      local_170 = *(undefined4 *)((long)local_198 + lVar2 + -4);
      local_16c = *(undefined4 *)((long)local_198 + lVar2);
      local_168 = &DAT_4093480000000000;
      p_Stack_160 = (_InputArray *)0x0;
      SStack_158.width = 0;
      SStack_158.height = 0;
      uStack_150 = 0;
      cv::rectangle(local_140,&local_178,&local_168,1,8,0);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < (ulong)((long)piStack_190 - (long)local_198 >> 4));
  }
  if (piStack_190 != local_198) {
    cv::Mat::Mat(local_90,(Mat *)local_100);
    local_a0.x = *local_198;
    local_a0.y = local_198[1];
    local_a0.width = local_198[2];
    local_a0.height = local_198[3];
    findEyes(local_90,&local_a0);
    cv::Mat::~Mat(local_90);
  }
  cv::Mat::~Mat((Mat *)local_100);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_128);
  if (local_198 != (int *)0x0) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void detectAndDisplay( cv::Mat frame ) {
  std::vector<cv::Rect> faces;
  //cv::Mat frame_gray;

  std::vector<cv::Mat> rgbChannels(3);
  cv::split(frame, rgbChannels);
  cv::Mat frame_gray = rgbChannels[2];

  //cvtColor( frame, frame_gray, CV_BGR2GRAY );
  //equalizeHist( frame_gray, frame_gray );
  //cv::pow(frame_gray, CV_64F, frame_gray);
  //-- Detect faces
  face_cascade.detectMultiScale( frame_gray, faces, 1.1, 2, 0|cv::CASCADE_SCALE_IMAGE|cv::CASCADE_FIND_BIGGEST_OBJECT, cv::Size(150, 150) );
//  findSkin(debugImage);



  for( int i = 0; i < faces.size(); i++ )
  {
    rectangle(debugImage, faces[i], 1234);
  }
  //-- Show what you got

  if (faces.size() > 0) {
    auto max = faces[0].width;
    int pos = 0;
    for(int i = 1; i < faces.size(); i++){
      if(faces[i].width > max){
        max = faces[i].width;
        pos = i;
      }
    }
    findEyes(frame_gray, faces[0]);
  }
}